

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPreviewImageAttribute.cpp
# Opt level: O3

void __thiscall
Imf_3_4::TypedAttribute<Imf_3_4::PreviewImage>::readValueFrom
          (TypedAttribute<Imf_3_4::PreviewImage> *this,IStream *is,int size,int version)

{
  uint width;
  InputExc *this_00;
  undefined4 in_register_0000000c;
  ulong uVar1;
  long lVar2;
  PreviewRgba *pPVar3;
  PreviewImage p;
  PreviewImage local_38;
  
  (*is->_vptr_IStream[3])(is,&local_38,4,CONCAT44(in_register_0000000c,version));
  width = local_38._width;
  lVar2 = (long)(int)local_38._width;
  (*is->_vptr_IStream[3])(is,&local_38,4);
  if (-1 < lVar2) {
    if (-1 < (int)local_38._width) {
      if (lVar2 * (ulong)local_38._width * 4 + 8 == (long)size) {
        PreviewImage::PreviewImage(&local_38,width,local_38._width,(PreviewRgba *)0x0);
        if (0 < (int)(local_38._height * local_38._width)) {
          uVar1 = (ulong)(local_38._height * local_38._width);
          pPVar3 = local_38._pixels;
          do {
            (*is->_vptr_IStream[3])(is,pPVar3,1);
            (*is->_vptr_IStream[3])(is,&pPVar3->g,1);
            (*is->_vptr_IStream[3])(is,&pPVar3->b,1);
            (*is->_vptr_IStream[3])(is,&pPVar3->a,1);
            pPVar3 = pPVar3 + 1;
            uVar1 = uVar1 - 1;
          } while (uVar1 != 0);
        }
        PreviewImage::operator=(&this->_value,&local_38);
        PreviewImage::~PreviewImage(&local_38);
        return;
      }
      this_00 = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::InputExc::InputExc
                (this_00,"Mismatch between Preview Image Attribute size and dimensions");
      goto LAB_00196acd;
    }
  }
  this_00 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::InputExc::InputExc(this_00,"Invalid dimensions in Preview Image Attribute");
LAB_00196acd:
  __cxa_throw(this_00,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
}

Assistant:

IMF_EXPORT void
PreviewImageAttribute::readValueFrom (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int size, int version)
{
    int width, height;

    Xdr::read<StreamIO> (is, width);
    Xdr::read<StreamIO> (is, height);

    if (width < 0 || height < 0)
    {
        throw IEX_NAMESPACE::InputExc (
            "Invalid dimensions in Preview Image Attribute");
    }

    // total attribute size should be four bytes per pixel + 8 bytes for width and height dimensions
    if (static_cast<uint64_t> (width) * static_cast<uint64_t> (height) * 4l +
            8l !=
        static_cast<uint64_t> (size))
    {
        throw IEX_NAMESPACE::InputExc (
            "Mismatch between Preview Image Attribute size and dimensions");
    }

    PreviewImage p (width, height);

    int          numPixels = p.width () * p.height ();
    PreviewRgba* pixels    = p.pixels ();

    for (int i = 0; i < numPixels; ++i)
    {
        Xdr::read<StreamIO> (is, pixels[i].r);
        Xdr::read<StreamIO> (is, pixels[i].g);
        Xdr::read<StreamIO> (is, pixels[i].b);
        Xdr::read<StreamIO> (is, pixels[i].a);
    }

    _value = p;
}